

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O3

void __thiscall
CivetServer::CivetServer
          (CivetServer *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *options,CivetCallbacks *_callbacks,void *UserContextIn)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  mg_context *pmVar3;
  runtime_error *this_00;
  pointer pbVar4;
  ulong uVar5;
  _func_void_mg_connection_ptr *p_Var6;
  vector<const_char_*,_std::allocator<const_char_*>_> pointers;
  string exceptionMsg;
  CivetCallbacks callbacks;
  char errtxtbuf [256];
  vector<const_char_*,_std::allocator<const_char_*>_> local_230;
  undefined1 *local_218 [2];
  undefined1 local_208 [16];
  mg_error_data local_1f8;
  mg_init_data local_1e0;
  mg_callbacks local_1c8;
  allocator_type local_138 [264];
  
  this->_vptr_CivetServer = (_func_int **)&PTR__CivetServer_00139918;
  p_Var6 = (_func_void_mg_connection_ptr *)0x0;
  this->context = (mg_context *)0x0;
  p_Var1 = &(this->connections)._M_t._M_impl.super__Rb_tree_header;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  memset(&local_1c8,0,0x90);
  this->UserContext = UserContextIn;
  if (_callbacks != (CivetCallbacks *)0x0) {
    memcpy(&local_1c8,_callbacks,0x90);
    p_Var6 = (_callbacks->super_mg_callbacks).connection_close;
  }
  this->userCloseHandler = p_Var6;
  local_1c8.connection_close = closeHandler;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_230,
             ((long)(options->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(options->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) + 1,local_138);
  pbVar4 = (options->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((options->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar4) {
    lVar2 = 0;
    uVar5 = 0;
    do {
      local_230.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar5] =
           *(char **)((long)&(pbVar4->_M_dataplus)._M_p + lVar2);
      uVar5 = uVar5 + 1;
      pbVar4 = (options->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 0x20;
    } while (uVar5 < (ulong)((long)(options->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5))
    ;
  }
  local_230.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish[-1] = (char *)0x0;
  local_1e0.configuration_options =
       local_230.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1f8.code = 0;
  local_1f8.code_sub = 0;
  local_1e0.callbacks = &local_1c8;
  local_1e0.user_data = this;
  memset(local_138,0,0x100);
  local_1f8.text_buffer_size = 0x100;
  local_1f8.text = (char *)local_138;
  pmVar3 = mg_start2(&local_1e0,&local_1f8);
  this->context = pmVar3;
  if (pmVar3 != (mg_context *)0x0) {
    if (local_230.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_230.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_218,
             "null context when constructing CivetServer. Possible problem binding to port. Error: "
             ,"");
  std::__cxx11::string::append((char *)local_218);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,(string *)local_218);
  *(undefined ***)this_00 = &PTR__runtime_error_00139a50;
  __cxa_throw(this_00,&CivetException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

CivetServer::CivetServer(const std::vector<std::string> &options,
                         const struct CivetCallbacks *_callbacks,
                         const void *UserContextIn)
    : context(0)
{
	struct CivetCallbacks callbacks;

	UserContext = UserContextIn;

	if (_callbacks) {
		callbacks = *_callbacks;
		userCloseHandler = _callbacks->connection_close;
	} else {
		userCloseHandler = NULL;
	}
	callbacks.connection_close = closeHandler;

	std::vector<const char *> pointers(options.size() + 1);
	for (size_t i = 0; i < options.size(); i++) {
		pointers[i] = (options[i].c_str());
	}
	pointers.back() = NULL;

	struct mg_init_data mg_start_init_data = {0};
	mg_start_init_data.callbacks = &callbacks;
	mg_start_init_data.user_data = this;
	mg_start_init_data.configuration_options = &pointers[0];

	struct mg_error_data mg_start_error_data = {0};
	char errtxtbuf[256] = {0};
	mg_start_error_data.text = errtxtbuf;
	mg_start_error_data.text_buffer_size = sizeof(errtxtbuf);

	context = mg_start2(&mg_start_init_data, &mg_start_error_data);

	if (context == NULL) {
		std::string exceptionMsg =
		    "null context when constructing CivetServer. "
		    "Possible problem binding to port. Error: ";
		exceptionMsg += errtxtbuf;
		throw CivetException(exceptionMsg);
	}
}